

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

void xmlFatalErr(xmlParserCtxtPtr ctxt,xmlParserErrors code,char *info)

{
  char *pcVar1;
  char *errmsg;
  char *info_local;
  xmlParserErrors code_local;
  xmlParserCtxtPtr ctxt_local;
  
  pcVar1 = xmlErrString(code);
  if (info == (char *)0x0) {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0
               ,(xmlChar *)0x0,0,"%s\n",pcVar1);
  }
  else {
    xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,code,XML_ERR_FATAL,(xmlChar *)info,
               (xmlChar *)0x0,(xmlChar *)0x0,0,"%s: %s\n",pcVar1,info);
  }
  return;
}

Assistant:

void
xmlFatalErr(xmlParserCtxtPtr ctxt, xmlParserErrors code, const char *info)
{
    const char *errmsg;

    errmsg = xmlErrString(code);

    if (info == NULL) {
        xmlCtxtErr(ctxt, NULL, XML_FROM_PARSER, code, XML_ERR_FATAL,
                   NULL, NULL, NULL, 0, "%s\n", errmsg);
    } else {
        xmlCtxtErr(ctxt, NULL, XML_FROM_PARSER, code, XML_ERR_FATAL,
                   (const xmlChar *) info, NULL, NULL, 0,
                   "%s: %s\n", errmsg, info);
    }
}